

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O3

bool_t ExprIsIntEx(tchar_t **p,wchar_t Size,intptr_t *Out)

{
  char cVar1;
  char cVar2;
  bool_t bVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  
  pcVar7 = *p;
  cVar1 = *pcVar7;
  if ((cVar1 == '-') || (cVar2 = cVar1, cVar1 == '+')) {
    pcVar8 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
    cVar2 = *pcVar8;
  }
  bVar3 = IsDigit((int)cVar2);
  if (bVar3 != 0) {
    iVar6 = Size + L'\xffffffff';
    lVar5 = 0;
    do {
      pcVar8 = pcVar7 + 1;
      lVar5 = (long)*pcVar7 + lVar5 * 10 + -0x30;
      bVar9 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar9) {
        lVar4 = -lVar5;
        if (cVar1 != '-') {
          lVar4 = lVar5;
        }
        *Out = lVar4;
        *p = pcVar8;
        return 1;
      }
      bVar3 = IsDigit((int)*pcVar8);
      pcVar7 = pcVar8;
    } while (bVar3 != 0);
  }
  return 0;
}

Assistant:

NOINLINE bool_t ExprIsIntEx(const tchar_t** p,int Size,intptr_t* Out)
{
    const tchar_t* s = *p;
    intptr_t v = 0;

    bool_t Pos = *s == '+';
    bool_t Neg = *s == '-';
    if (Neg || Pos) ++s;

    if (!IsDigit(*s))
        return 0;

    do
    {
        v = v*10 + (*s-'0');
    }
    while (--Size && IsDigit(*(++s)));

    if (Size!=0)
        return 0;

    if (Neg)
        v = -v;

    *Out = v;
    *p = s+1;
    return 1;
}